

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::ReadPaths(CrateReader *this)

{
  byte bVar1;
  pointer pSVar2;
  StreamReader *this_00;
  bool bVar3;
  ostream *poVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong uVar7;
  long *plVar8;
  ulong *puVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  uint64_t num_paths;
  string __str_1;
  string __str_2;
  string __str;
  ostringstream ss_e;
  long *local_2a8;
  long local_298;
  undefined8 uStack_290;
  ulong *local_288;
  long local_280;
  ulong local_278;
  long lStack_270;
  ulong *local_268;
  long local_260;
  ulong local_258;
  long lStack_250;
  long *local_248;
  undefined8 local_240;
  long local_238;
  undefined8 uStack_230;
  ulong *local_228;
  long local_220;
  ulong local_218 [2];
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar10 = this->_paths_index;
  if ((lVar10 < 0) ||
     (pSVar2 = (this->_toc).sections.
               super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(this->_toc).sections.
           super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>.
           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 5 <= lVar10)) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadPaths",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x17f8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar12 = "Invalid index for `PATHS` section.";
LAB_001d3009:
    lVar10 = 0x22;
LAB_001d300e:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar12,lVar10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2a8);
    if (local_2a8 == &local_298) goto LAB_001d306d;
  }
  else {
    if ((this->_version[0] != '\0') || (3 < this->_version[1])) {
      this_00 = this->_sr;
      uVar13 = pSVar2[lVar10].start;
      if (this_00->length_ < uVar13) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadPaths",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x1806);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pcVar12 = "Failed to move to `PATHS` section.";
        goto LAB_001d3009;
      }
      this_00->idx_ = uVar13;
      bVar3 = StreamReader::read8(this_00,(uint64_t *)&local_288);
      if (bVar3) {
        if (local_288 == (ulong *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadPaths",9);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x1812);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar12 = "`PATHS` is empty.";
          lVar10 = 0x11;
        }
        else {
          if ((ulong *)(this->_config).maxNumPaths < local_288) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadPaths",9)
            ;
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x1816);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            pcVar12 = "Too many Paths in `PATHS` section.";
            goto LAB_001d3009;
          }
          uVar7 = this->_memoryUsage + (long)local_288 * 0xd0;
          this->_memoryUsage = uVar7;
          uVar13 = (this->_config).maxMemoryBudget;
          if (uVar13 < uVar7) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadPaths",9)
            ;
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            iVar11 = 0x1819;
          }
          else {
            uVar7 = uVar7 + (long)local_288 * 0xd0;
            this->_memoryUsage = uVar7;
            if (uVar13 < uVar7) {
              ::std::__cxx11::ostringstream::ostringstream(local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadPaths",9);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              iVar11 = 0x181a;
            }
            else {
              uVar7 = uVar7 + (long)local_288 * 0x1f8;
              this->_memoryUsage = uVar7;
              if (uVar7 <= uVar13) {
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::resize
                          (&this->_paths,(size_type)local_288);
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::resize
                          (&this->_elemPaths,(size_type)local_288);
                ::std::
                vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                ::resize(&this->_nodes,(size_type)local_288);
                bVar3 = ReadCompressedPaths(this,(uint64_t)local_288);
                if (bVar3) {
                  return true;
                }
                ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReadPaths",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x1822);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                pcVar12 = "Failed to read compressed paths.";
                lVar10 = 0x20;
                goto LAB_001d300e;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadPaths",9);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              iVar11 = 0x181b;
            }
          }
          poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,iVar11);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar12 = "Reached to max memory budget.";
          lVar10 = 0x1d;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadPaths",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x180c);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pcVar12 = "Failed to read # of paths at `PATHS` section.";
        lVar10 = 0x2d;
      }
      goto LAB_001d300e;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadPaths",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x17ff);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    bVar1 = this->_version[0];
    uVar14 = 1;
    if (9 < bVar1) {
      uVar14 = 3 - (bVar1 < 100);
    }
    local_1c8[0] = local_1b8;
    ::std::__cxx11::string::_M_construct((ulong)local_1c8,(char)uVar14);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1c8[0],uVar14,(uint)bVar1);
    plVar5 = (long *)::std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x3fcadc);
    local_1e8 = &local_1d8;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_1d8 = *plVar8;
      lStack_1d0 = plVar5[3];
    }
    else {
      local_1d8 = *plVar8;
      local_1e8 = (long *)*plVar5;
    }
    local_1e0 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1e8);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_258 = *puVar9;
      lStack_250 = plVar5[3];
      local_268 = &local_258;
    }
    else {
      local_258 = *puVar9;
      local_268 = (ulong *)*plVar5;
    }
    local_260 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    bVar1 = this->_version[1];
    uVar14 = 1;
    if (9 < bVar1) {
      uVar14 = 3 - (bVar1 < 100);
    }
    local_228 = local_218;
    ::std::__cxx11::string::_M_construct((ulong)&local_228,(char)uVar14);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_228,uVar14,(uint)bVar1);
    uVar13 = 0xf;
    if (local_268 != &local_258) {
      uVar13 = local_258;
    }
    if (uVar13 < (ulong)(local_220 + local_260)) {
      uVar13 = 0xf;
      if (local_228 != local_218) {
        uVar13 = local_218[0];
      }
      if (uVar13 < (ulong)(local_220 + local_260)) goto LAB_001d34af;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_268);
    }
    else {
LAB_001d34af:
      puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_228);
    }
    local_248 = &local_238;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_238 = *plVar5;
      uStack_230 = puVar6[3];
    }
    else {
      local_238 = *plVar5;
      local_248 = (long *)*puVar6;
    }
    local_240 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_248);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_278 = *puVar9;
      lStack_270 = plVar5[3];
      local_288 = &local_278;
    }
    else {
      local_278 = *puVar9;
      local_288 = (ulong *)*plVar5;
    }
    local_280 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    bVar1 = this->_version[2];
    uVar14 = 1;
    if (9 < bVar1) {
      uVar14 = 3 - (bVar1 < 100);
    }
    local_208 = local_1f8;
    ::std::__cxx11::string::_M_construct((ulong)&local_208,(char)uVar14);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_208,uVar14,(uint)bVar1);
    uVar13 = 0xf;
    if (local_288 != &local_278) {
      uVar13 = local_278;
    }
    if (uVar13 < (ulong)(local_200 + local_280)) {
      uVar13 = 0xf;
      if (local_208 != local_1f8) {
        uVar13 = local_1f8[0];
      }
      if (uVar13 < (ulong)(local_200 + local_280)) goto LAB_001d36c3;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_288);
    }
    else {
LAB_001d36c3:
      puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_208);
    }
    local_2a8 = &local_298;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_298 = *plVar5;
      uStack_290 = puVar6[3];
    }
    else {
      local_298 = *plVar5;
      local_2a8 = (long *)*puVar6;
    }
    lVar10 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_2a8,lVar10);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2a8);
    if (local_2a8 == &local_298) goto LAB_001d306d;
  }
  operator_delete(local_2a8,local_298 + 1);
LAB_001d306d:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadPaths() {
  if ((_paths_index < 0) || (_paths_index >= int64_t(_toc.sections.size()))) {
    PUSH_ERROR("Invalid index for `PATHS` section.");
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    PUSH_ERROR("Version must be 0.4.0 or later, but got " +
               std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
               "." + std::to_string(_version[2]));
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_paths_index)];

  if (!_sr->seek_set(uint64_t(s.start))) {
    PUSH_ERROR("Failed to move to `PATHS` section.");
    return false;
  }

  uint64_t num_paths;
  if (!_sr->read8(&num_paths)) {
    PUSH_ERROR("Failed to read # of paths at `PATHS` section.");
    return false;
  }

  if (num_paths == 0) {
    // At least root path exits.
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`PATHS` is empty.");
  }

  if (num_paths > _config.maxNumPaths) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many Paths in `PATHS` section.");
  }

  CHECK_MEMORY_USAGE(size_t(num_paths) * sizeof(Path)); // conservative estimation
  CHECK_MEMORY_USAGE(size_t(num_paths) * sizeof(Path)); // conservative estimation
  CHECK_MEMORY_USAGE(size_t(num_paths) * sizeof(Node)); // conservative estimation

  _paths.resize(static_cast<size_t>(num_paths));
  _elemPaths.resize(static_cast<size_t>(num_paths));
  _nodes.resize(static_cast<size_t>(num_paths));

  if (!ReadCompressedPaths(num_paths)) {
    PUSH_ERROR("Failed to read compressed paths.");
    return false;
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  DCOUT("# of paths " << _paths.size());

  for (size_t i = 0; i < _paths.size(); i++) {
    DCOUT("path[" << i << "] = " << _paths[i].full_path_name());
  }
#endif

  return true;
}